

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

int FBaseCVar::ToInt(UCVarValue value,ECVarType type)

{
  int iVar1;
  long lVar2;
  uint local_18;
  int res;
  ECVarType type_local;
  UCVarValue value_local;
  
  res = value._0_4_;
  switch(type) {
  case CVAR_Bool:
    res._0_1_ = value.Bool;
    local_18 = (uint)(res._0_1_ & 1);
    break;
  case CVAR_Int:
    local_18 = res;
    break;
  case CVAR_Float:
    local_18 = (uint)(float)res;
    break;
  case CVAR_String:
    iVar1 = strcasecmp(value.String,"true");
    if (iVar1 == 0) {
      local_18 = 1;
    }
    else {
      iVar1 = strcasecmp(value.String,"false");
      if (iVar1 == 0) {
        local_18 = 0;
      }
      else {
        lVar2 = strtol(value.String,(char **)0x0,0);
        local_18 = (uint)lVar2;
      }
    }
    break;
  default:
    local_18 = 0;
    break;
  case CVAR_GUID:
    local_18 = 0;
  }
  return local_18;
}

Assistant:

int FBaseCVar::ToInt (UCVarValue value, ECVarType type)
{
	int res;
#if __GNUC__ <= 2
	float tmp;
#endif

	switch (type)
	{
	case CVAR_Bool:			res = (int)value.Bool; break;
	case CVAR_Int:			res = value.Int; break;
#if __GNUC__ <= 2
	case CVAR_Float:		tmp = value.Float; res = (int)tmp; break;
#else
	case CVAR_Float:		res = (int)value.Float; break;
#endif
	case CVAR_String:		
		{
			if (stricmp (value.String, "true") == 0)
				res = 1;
			else if (stricmp (value.String, "false") == 0)
				res = 0;
			else
				res = strtol (value.String, NULL, 0); 
			break;
		}
	case CVAR_GUID:			res = 0; break;
	default:				res = 0; break;
	}
	return res;
}